

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_engine.h
# Opt level: O0

bool __thiscall
BamTools::FilterEngine<BamTools::BamAlignmentChecker>::setProperty<std::__cxx11::string>
          (FilterEngine<BamTools::BamAlignmentChecker> *this,string *filterName,string *propertyName
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          ValueCompareType *type)

{
  __normal_iterator<BamTools::Property_*,_std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>_>
  __last;
  __normal_iterator<BamTools::Property_*,_std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>_>
  __first;
  bool bVar1;
  reference ppVar2;
  reference ppVar3;
  value_type *__x;
  reference pPVar4;
  string *in_RCX;
  long in_RDI;
  ValueCompareType *in_R8;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_PropertyFilterValue>_>::value,_pair<iterator,_bool>_>
  _Var5;
  iterator knownPropertyIter;
  PropertyFilterValue *filterValue;
  bool success;
  iterator propertyIter;
  PropertyFilter *filter;
  iterator filterIter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>_>_>
  *in_stack_fffffffffffffe38;
  PropertyFilterValue *in_stack_fffffffffffffe40;
  vector<BamTools::Property,_std::allocator<BamTools::Property>_> *this_00;
  __normal_iterator<BamTools::Property_*,_std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>_>
  in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  byte in_stack_fffffffffffffe57;
  __normal_iterator<BamTools::Property_*,_std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>_>
  in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  pointer in_stack_fffffffffffffe90;
  __normal_iterator<BamTools::Property_*,_std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>_>
  local_130;
  Property local_128;
  PropertyFilterValue *local_100;
  _Base_ptr local_f8;
  byte local_f0;
  string local_d8 [104];
  _Base_ptr local_70;
  byte local_68;
  _Self local_60;
  byte local_51;
  _Self local_50;
  PropertyFilter *local_48;
  _Self local_40;
  _Self local_38;
  ValueCompareType *local_30;
  string *local_28;
  bool local_1;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>_>
               *)in_stack_fffffffffffffe38,(key_type *)0x209409);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>_>
              *)in_stack_fffffffffffffe38);
  bVar1 = std::operator==(&local_38,&local_40);
  if (bVar1) {
    local_1 = false;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilter>_>
                          *)0x209458);
    local_48 = &ppVar2->second;
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>_>_>
         ::find(in_stack_fffffffffffffe38,(key_type *)0x209479);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>_>_>
         ::end(in_stack_fffffffffffffe38);
    bVar1 = std::operator==(&local_50,&local_60);
    if (bVar1) {
      std::__cxx11::string::string(local_d8,local_28);
      Variant::Variant<std::__cxx11::string>
                ((Variant *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      PropertyFilterValue::PropertyFilterValue
                ((PropertyFilterValue *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 (Variant *)in_stack_fffffffffffffe48._M_current,
                 (ValueCompareType *)in_stack_fffffffffffffe40);
      std::make_pair<std::__cxx11::string_const&,BamTools::PropertyFilterValue>
                (&(in_stack_fffffffffffffe48._M_current)->Name,in_stack_fffffffffffffe40);
      _Var5 = std::
              map<std::__cxx11::string,BamTools::PropertyFilterValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,BamTools::PropertyFilterValue>>>
              ::insert<std::pair<std::__cxx11::string,BamTools::PropertyFilterValue>>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>
                          *)in_stack_fffffffffffffe48._M_current);
      in_stack_fffffffffffffe58._M_current = (Property *)_Var5.first._M_node;
      in_stack_fffffffffffffe57 = _Var5.second;
      local_51 = in_stack_fffffffffffffe57 & 1;
      local_f8 = (_Base_ptr)in_stack_fffffffffffffe58._M_current;
      local_f0 = in_stack_fffffffffffffe57;
      local_70 = (_Base_ptr)in_stack_fffffffffffffe58._M_current;
      local_68 = in_stack_fffffffffffffe57;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>
               *)in_stack_fffffffffffffe40);
      PropertyFilterValue::~PropertyFilterValue((PropertyFilterValue *)0x2095b4);
      Variant::~Variant(&in_stack_fffffffffffffe40->Value);
      std::__cxx11::string::~string(local_d8);
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::PropertyFilterValue>_>
                            *)0x20966f);
      local_100 = &ppVar3->second;
      in_stack_fffffffffffffe48._M_current = &local_128;
      std::__cxx11::string::string((string *)in_stack_fffffffffffffe48._M_current,local_28);
      Variant::Variant<std::__cxx11::string>
                ((Variant *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      Variant::operator=(&in_stack_fffffffffffffe40->Value,(Variant *)in_stack_fffffffffffffe38);
      Variant::~Variant(&in_stack_fffffffffffffe40->Value);
      std::__cxx11::string::~string((string *)&local_128);
      local_100->Type = *local_30;
      local_51 = 1;
    }
    if ((local_51 & 1) == 0) {
      local_1 = false;
    }
    else {
      std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>::begin
                ((vector<BamTools::Property,_std::allocator<BamTools::Property>_> *)
                 in_stack_fffffffffffffe38);
      std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>::end
                ((vector<BamTools::Property,_std::allocator<BamTools::Property>_> *)
                 in_stack_fffffffffffffe38);
      __last._M_current._7_1_ = in_stack_fffffffffffffe57;
      __last._M_current._0_7_ = in_stack_fffffffffffffe50;
      local_130 = std::
                  find<__gnu_cxx::__normal_iterator<BamTools::Property*,std::vector<BamTools::Property,std::allocator<BamTools::Property>>>,std::__cxx11::string>
                            (in_stack_fffffffffffffe58,__last,
                             &(in_stack_fffffffffffffe48._M_current)->Name);
      std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>::end
                ((vector<BamTools::Property,_std::allocator<BamTools::Property>_> *)
                 in_stack_fffffffffffffe38);
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<BamTools::Property_*,_std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>_>
                          *)in_stack_fffffffffffffe40,
                         (__normal_iterator<BamTools::Property_*,_std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>_>
                          *)in_stack_fffffffffffffe38);
      if (bVar1) {
        __x = (value_type *)(in_RDI + 0x30);
        this_00 = (vector<BamTools::Property,_std::allocator<BamTools::Property>_> *)
                  &stack0xfffffffffffffe90;
        Property::Property((Property *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50)
                           ,&(in_stack_fffffffffffffe48._M_current)->Name,
                           SUB81((ulong)this_00 >> 0x38,0));
        std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>::push_back(this_00,__x)
        ;
        Property::~Property((Property *)0x2097fc);
        std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>::begin
                  ((vector<BamTools::Property,_std::allocator<BamTools::Property>_> *)__x);
        std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>::end
                  ((vector<BamTools::Property,_std::allocator<BamTools::Property>_> *)__x);
        __first._M_current._7_1_ = in_stack_fffffffffffffe57;
        __first._M_current._0_7_ = in_stack_fffffffffffffe50;
        std::
        sort<__gnu_cxx::__normal_iterator<BamTools::Property*,std::vector<BamTools::Property,std::allocator<BamTools::Property>>>>
                  (__first,in_stack_fffffffffffffe48);
      }
      else {
        pPVar4 = __gnu_cxx::
                 __normal_iterator<BamTools::Property_*,_std::vector<BamTools::Property,_std::allocator<BamTools::Property>_>_>
                 ::operator*(&local_130);
        pPVar4->IsEnabled = true;
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool FilterEngine<FilterChecker>::setProperty(const std::string& filterName,
                                              const std::string& propertyName, const T& value,
                                              const PropertyFilterValue::ValueCompareType& type)
{
    // lookup filter by name, return false if not found
    FilterMap::iterator filterIter = m_filters.find(filterName);
    if (filterIter == m_filters.end()) return false;

    // lookup property for filter, add new PropertyFilterValue if not found, modify if already exists
    PropertyFilter& filter = (*filterIter).second;
    PropertyMap::iterator propertyIter = filter.Properties.find(propertyName);

    bool success;

    // property not found for this filter, create new entry
    if (propertyIter == filter.Properties.end())
        success = (filter.Properties.insert(
                       std::make_pair(propertyName, PropertyFilterValue(value, type))))
                      .second;

    // property already exists, modify
    else {
        PropertyFilterValue& filterValue = (*propertyIter).second;
        filterValue.Value = value;
        filterValue.Type = type;
        success = true;
    }

    // if error so far, return false
    if (!success) return false;

    // --------------------------------------------
    // otherwise, set Property.IsEnabled to true

    // lookup property
    std::vector<Property>::iterator knownPropertyIter =
        std::find(m_properties.begin(), m_properties.end(), propertyName);

    // if not found, create a new (enabled) entry (& re-sort list)
    if (knownPropertyIter == m_properties.end()) {
        m_properties.push_back(Property(propertyName, true));
        std::sort(m_properties.begin(), m_properties.end());
    }

    // property already known, set as enabled
    else
        (*knownPropertyIter).IsEnabled = true;

    // return success
    return true;
}